

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O3

LinConEQ * __thiscall
mp::LinearFunctionalConstraint::to_linear_constraint
          (LinConEQ *__return_storage_ptr__,LinearFunctionalConstraint *this)

{
  LinTerms le;
  int local_114;
  inline_storage<double,_6U> *local_110;
  ulong local_108;
  long local_100;
  inline_storage<double,_6U> local_f8;
  inline_storage<int,_6U> *local_c8;
  ulong local_c0;
  long local_b8;
  inline_storage<int,_6U> local_b0;
  LinTerms local_98;
  undefined1 *local_20;
  
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)&local_110,&this->affine_expr_);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_c8,
             &(this->affine_expr_).super_LinTerms.vars_);
  local_114 = (this->super_FunctionalConstraint).result_var_;
  local_20 = &DAT_bff0000000000000;
  gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
            ((small_vector_base<std::allocator<double>,6u> *)&local_110,(double *)&local_20);
  gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
            ((small_vector_base<std::allocator<int>,6u> *)&local_c8,&local_114);
  if (local_108 < 7) {
    local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_100 != 0) {
      memcpy(local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,local_110,
             local_100 * 8);
    }
  }
  else {
    local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)local_110;
    local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_108;
    local_108 = 6;
    local_100 = 0;
    local_110 = &local_f8;
  }
  if (local_c0 < 7) {
    local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_b8 != 0) {
      memcpy(local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,local_c8,local_b8 * 4);
    }
  }
  else {
    local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_c8;
    local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_c0;
    local_c0 = 6;
    local_b8 = 0;
    local_c8 = &local_b0;
  }
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (__return_storage_ptr__,&local_98,
             (AlgConRhs<0>)((this->affine_expr_).constant_term_ ^ 0x8000000000000000),true);
  if (6 < local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_98.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_98.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_c0) {
    operator_delete(local_c8,local_c0 << 2);
  }
  if (6 < local_108) {
    operator_delete(local_110,local_108 << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

LinConEQ to_linear_constraint() const {
    const auto& ae = GetAffineExpr();
    auto le = ae.GetLinTerms();
    le.add_term(-1.0, FunctionalConstraint::GetResultVar());
    return { std::move(le), -ae.constant_term() };
  }